

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

Matches * __thiscall
Catch::TestSpec::matchesByFilter
          (Matches *__return_storage_ptr__,TestSpec *this,
          vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *testCases,
          IConfig *config)

{
  pointer this_00;
  bool bVar1;
  size_type __n;
  TestCaseInfo *testCase;
  Filter *filter_00;
  value_type local_d8;
  TestCaseHandle *local_a0;
  TestCaseHandle *local_98;
  TestCaseHandle *test;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *__range2;
  vector<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>
  currentMatches;
  Filter *filter;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *__range1;
  IConfig *config_local;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *testCases_local;
  TestSpec *this_local;
  Matches *matches;
  
  std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::vector
            (__return_storage_ptr__);
  __n = std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::size
                  (&this->m_filters);
  std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::reserve
            (__return_storage_ptr__,__n);
  __end1 = std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::begin
                     (&this->m_filters);
  filter = (Filter *)
           std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::end
                     (&this->m_filters);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_Catch::TestSpec::Filter_*,_std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>_>
                                     *)&filter), bVar1) {
    currentMatches.
    super__Vector_base<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<const_Catch::TestSpec::Filter_*,_std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>_>
                  ::operator*(&__end1);
    std::vector<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>::
    vector((vector<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_> *)
           &__range2);
    __end2 = std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::begin
                       (testCases);
    test = (TestCaseHandle *)
           std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::end
                     (testCases);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
                                       *)&test), bVar1) {
      local_98 = __gnu_cxx::
                 __normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
                 ::operator*(&__end2);
      bVar1 = isThrowSafe(local_98,config);
      this_00 = currentMatches.
                super__Vector_base<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (bVar1) {
        testCase = TestCaseHandle::getTestCaseInfo(local_98);
        bVar1 = Filter::matches((Filter *)this_00,testCase);
        if (bVar1) {
          local_a0 = local_98;
          std::vector<Catch::TestCaseHandle_const*,std::allocator<Catch::TestCaseHandle_const*>>::
          emplace_back<Catch::TestCaseHandle_const*>
                    ((vector<Catch::TestCaseHandle_const*,std::allocator<Catch::TestCaseHandle_const*>>
                      *)&__range2,&local_a0);
        }
      }
      __gnu_cxx::
      __normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
      ::operator++(&__end2);
    }
    extractFilterName_abi_cxx11_
              (&local_d8.name,
               (TestSpec *)
               currentMatches.
               super__Vector_base<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,filter_00);
    std::vector<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>::
    vector(&local_d8.tests,
           (vector<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_> *)
           &__range2);
    std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
    push_back(__return_storage_ptr__,&local_d8);
    FilterMatch::~FilterMatch(&local_d8);
    std::vector<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>::
    ~vector((vector<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_> *
            )&__range2);
    __gnu_cxx::
    __normal_iterator<const_Catch::TestSpec::Filter_*,_std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

TestSpec::Matches TestSpec::matchesByFilter( std::vector<TestCaseHandle> const& testCases, IConfig const& config ) const {
        Matches matches;
        matches.reserve( m_filters.size() );
        for ( auto const& filter : m_filters ) {
            std::vector<TestCaseHandle const*> currentMatches;
            for ( auto const& test : testCases )
                if ( isThrowSafe( test, config ) &&
                     filter.matches( test.getTestCaseInfo() ) )
                    currentMatches.emplace_back( &test );
            matches.push_back(
                FilterMatch{ extractFilterName( filter ), currentMatches } );
        }
        return matches;
    }